

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void __thiscall disp::get_3(disp *this,int x,int y,int z)

{
  long in_RDI;
  int in_stack_000000ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_stack_ffffffffffffff18;
  string local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  __rhs = &local_98;
  ts<int>(in_stack_000000ac);
  std::operator+(in_stack_ffffffffffffff18,__rhs);
  ts<int>(in_stack_000000ac);
  std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  ts<int>(in_stack_000000ac);
  std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

void get_3(int x,int y,int z) { v_="get_3" + ts(x)+ts(y)+ts(z); }